

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_recursive_cte.hpp
# Opt level: O1

void __thiscall duckdb::LogicalRecursiveCTE::~LogicalRecursiveCTE(LogicalRecursiveCTE *this)

{
  pointer pcVar1;
  
  (this->super_LogicalCTE).super_LogicalOperator._vptr_LogicalOperator =
       (_func_int **)&PTR__LogicalRecursiveCTE_019acf68;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&this->key_targets);
  (this->super_LogicalCTE).super_LogicalOperator._vptr_LogicalOperator =
       (_func_int **)&PTR__LogicalCTE_019adbb0;
  ::std::vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>::
  ~vector(&(this->super_LogicalCTE).correlated_columns.
           super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
         );
  pcVar1 = (this->super_LogicalCTE).ctename._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_LogicalCTE).ctename.field_2) {
    operator_delete(pcVar1);
  }
  LogicalOperator::~LogicalOperator((LogicalOperator *)this);
  operator_delete(this);
  return;
}

Assistant:

LogicalRecursiveCTE() : LogicalCTE(LogicalOperatorType::LOGICAL_RECURSIVE_CTE) {
	}